

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hotp.c
# Opt level: O3

char * mtotp_hotp_l(char *secret,size_t secret_len,uint64_t counter,int length,char *buf)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint8_t hmac [20];
  byte abStack_38 [19];
  byte local_25;
  ulong local_20;
  
  if (secret_len == 0) {
    __assert_fail("secret_len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/00-matt[P]minitotp/libminitotp/hotp.c"
                  ,0x22,"char *mtotp_hotp_l(const char *, size_t, uint64_t, int, char *)");
  }
  if (5 < length) {
    local_20 = counter >> 0x38 | (counter & 0xff000000000000) >> 0x28 |
               (counter & 0xff0000000000) >> 0x18 | (counter & 0xff00000000) >> 8 |
               (counter & 0xff000000) << 8 | (counter & 0xff0000) << 0x18 |
               (counter & 0xff00) << 0x28 | counter << 0x38;
    hmac_sha1((uint8_t *)secret,secret_len,(uint8_t *)&local_20,8,abStack_38);
    uVar2 = (ulong)(local_25 & 0xf);
    auVar11 = _DAT_00103020;
    iVar3 = 4;
    do {
      auVar7 = auVar11;
      auVar11._0_4_ = auVar7._0_4_ * 10;
      auVar8._8_4_ = (undefined4)((auVar7._8_8_ & 0xffffffff) * 10);
      auVar8._4_4_ = auVar8._8_4_;
      auVar8._0_4_ = auVar11._0_4_;
      iVar4 = auVar7._4_4_;
      auVar9._4_4_ = iVar4;
      auVar9._0_4_ = iVar4;
      auVar9._8_4_ = auVar7._12_4_;
      auVar9._12_4_ = auVar7._12_4_;
      auVar8._12_4_ = (int)((auVar9._8_8_ & 0xffffffff) * 10);
      auVar11._8_8_ = auVar8._8_8_;
      auVar11._4_4_ = iVar4 * 10;
      iVar4 = iVar3 + -4;
      iVar6 = iVar3 + (length + 3U & 0xfffffffc);
      iVar3 = iVar4;
    } while (iVar6 != 8);
    uVar1 = length - 1;
    uVar5 = -iVar4;
    auVar10._0_4_ = -(uint)((int)(uVar1 ^ 0x80000000) < (int)(uVar5 ^ 0x80000000));
    auVar10._4_4_ = -(uint)((int)(uVar1 ^ 0x80000000) < (int)((uVar5 | 1) ^ 0x80000000));
    auVar10._8_4_ = -(uint)((int)(uVar1 ^ 0x80000000) < (int)((uVar5 | 2) ^ 0x80000000));
    auVar10._12_4_ = -(uint)((int)(uVar1 ^ 0x80000000) < (int)((uVar5 | 3) ^ 0x80000000));
    auVar11 = ~auVar10 & auVar11 | auVar7 & auVar10;
    pad_otp((uint32_t)
            ((ulong)((uint)abStack_38[uVar2 + 2] << 8 |
                     (uint)abStack_38[uVar2 + 1] << 0x10 | (abStack_38[uVar2] & 0x7f) << 0x18 |
                    (uint)abStack_38[uVar2 + 3]) %
            (((ulong)auVar11._8_4_ * (ulong)auVar11._0_4_ & 0xffffffff) *
             ((ulong)auVar11._4_4_ * (ulong)auVar11._12_4_ & 0xffffffff) & 0xffffffff)),length,buf);
    return buf;
  }
  __assert_fail("length >= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/00-matt[P]minitotp/libminitotp/hotp.c"
                ,0x23,"char *mtotp_hotp_l(const char *, size_t, uint64_t, int, char *)");
}

Assistant:

char *mtotp_hotp_l(const char *secret, size_t secret_len, uint64_t counter,
                   int length, char *buf) {
  assert(secret_len > 0);
  assert(length >= 6);

  counter = htobe64(counter);
  uint8_t hmac[20];
  hmac_sha1((const uint8_t *)secret, secret_len, (const uint8_t *)&counter,
            sizeof(counter), hmac);

  uint32_t code = mod(dynamic_truncate(hmac), length);

  pad_otp(code, length, buf);

  return buf;
}